

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void shift_im(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  uint uVar2;
  TCGv_i32 arg1;
  TCGTemp *ts;
  uintptr_t o_1;
  uint arg2;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = *(uint *)(&DAT_00d7e48c + (long)opsize * 4);
  uVar2 = insn & 7;
  arg1 = gen_extend(s,tcg_ctx->cpu_dregs[uVar2],opsize,(insn & 8) >> 3 ^ 1);
  arg2 = 8;
  if ((insn & 0xe00) != 0) {
    arg2 = insn >> 9 & 7;
  }
  tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),0);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,arg1,arg2 - 1);
    if ((insn & 8) == 0) {
      tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
    else {
      tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
  }
  else {
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,arg1,uVar1 - arg2);
    tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
      if (arg2 < uVar1) {
        ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
        tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_V,arg1,uVar1 - 1);
        tcg_gen_sari_i32_m68k(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),arg1,(uVar1 - arg2) + -1)
        ;
        tcg_gen_setcond_i32_m68k
                  (tcg_ctx,TCG_COND_NE,QREG_CC_V,QREG_CC_V,(TCGv_i32)((long)ts - (long)tcg_ctx));
        tcg_temp_free_internal_m68k(tcg_ctx,ts);
      }
      else {
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_V,arg1,QREG_CC_V);
      }
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_neg_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                       (TCGArg)(QREG_CC_V + (long)tcg_ctx));
    }
  }
  if (opsize != 2) {
    if (opsize == 1) {
      tcg_gen_ext16s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    }
    else {
      if (opsize != 0) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x24c,(char *)0x0);
      }
      tcg_gen_ext8s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    }
  }
  tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,1);
  if (QREG_CC_Z != QREG_CC_N) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_N + (long)tcg_ctx));
  }
  if (QREG_CC_X != QREG_CC_C) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_X + (long)tcg_ctx),
                     (TCGArg)(QREG_CC_C + (long)tcg_ctx));
  }
  gen_partset_reg(tcg_ctx,opsize,tcg_ctx->cpu_dregs[uVar2],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void shift_im(DisasContext *s, uint16_t insn, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int count = (insn >> 9) & 7;
    int logical = insn & 8;
    int left = insn & 0x100;
    int bits = opsize_bytes(opsize) * 8;
    TCGv reg = gen_extend(s, DREG(insn, 0), opsize, !logical);

    if (count == 0) {
        count = 8;
    }

    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, bits - count);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, reg, count);

        /*
         * Note that ColdFire always clears V (done above),
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation.
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            /* if shift count >= bits, V is (reg != 0) */
            if (count >= bits) {
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, reg, QREG_CC_V);
            } else {
                TCGv t0 = tcg_temp_new(tcg_ctx);
                tcg_gen_sari_i32(tcg_ctx, QREG_CC_V, reg, bits - 1);
                tcg_gen_sari_i32(tcg_ctx, t0, reg, bits - count - 1);
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, t0);
                tcg_temp_free(tcg_ctx, t0);
            }
            tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        }
    } else {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, count - 1);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, reg, count);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, reg, count);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    gen_partset_reg(tcg_ctx, opsize, DREG(insn, 0), QREG_CC_N);
    set_cc_op(s, CC_OP_FLAGS);
}